

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annex_storage.h
# Opt level: O2

value_t __thiscall
lume::AnnexStorage<lume::Mesh::AnnexKey,lume::Annex>::optional_annex<lume::ArrayAnnex<unsigned_int>>
          (AnnexStorage<lume::Mesh::AnnexKey,lume::Annex> *this,AnnexKey *id)

{
  iterator iVar1;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  value_t vVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  iVar1 = std::
          _Rb_tree<lume::Mesh::AnnexKey,_std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>,_std::_Select1st<std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>_>,_std::less<lume::Mesh::AnnexKey>,_std::allocator<std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>_>_>
          ::find((_Rb_tree<lume::Mesh::AnnexKey,_std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>,_std::_Select1st<std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>_>,_std::less<lume::Mesh::AnnexKey>,_std::allocator<std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>_>_>
                  *)id,in_RDX);
  if (iVar1._M_node == (_Base_ptr)&(id->name)._M_string_length) {
    *(undefined8 *)this = 0;
    local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)(this + 8) = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    std::__shared_ptr<lume::Annex,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<lume::Annex,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<lume::Annex,_(__gnu_cxx::_Lock_policy)2> *)&iVar1._M_node[2]._M_parent)
    ;
    _Var2._M_pi = extraout_RDX;
  }
  vVar3.super___shared_ptr<lume::Annex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  vVar3.super___shared_ptr<lume::Annex,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (value_t)vVar3.super___shared_ptr<lume::Annex,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_t optional_annex (const TKey& id)
	{
		auto i = m_annexMap.find (id);
		if (i == m_annexMap.end())
			return std::shared_ptr<TConcreteType>();
		return i->second;
	}